

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util_test.cc
# Opt level: O0

void __thiscall
google::protobuf::util::anon_unknown_0::TimeUtilTest_DurationStringFormat_Test::TestBody
          (TimeUtilTest_DurationStringFormat_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *message;
  Duration *pDVar3;
  Duration *duration;
  Duration *duration_00;
  Duration *duration_01;
  Duration *duration_02;
  Duration *duration_03;
  Duration *duration_04;
  char *in_R9;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  AssertHelper local_750;
  Message local_748;
  int32_t local_740;
  int local_73c;
  undefined1 local_738 [8];
  AssertionResult gtest_ar_14;
  Message local_720;
  int64_t local_718;
  long local_710;
  undefined1 local_708 [8];
  AssertionResult gtest_ar_13;
  AssertHelper local_6d8;
  Message local_6d0;
  basic_string_view<char,_std::char_traits<char>_> local_6c8;
  bool local_6b1;
  undefined1 local_6b0 [8];
  AssertionResult gtest_ar__6;
  Message local_698;
  int32_t local_690;
  undefined1 local_68c [4];
  undefined1 local_688 [8];
  AssertionResult gtest_ar_12;
  Message local_670;
  int64_t local_668;
  long local_660;
  undefined1 local_658 [8];
  AssertionResult gtest_ar_11;
  AssertHelper local_628;
  Message local_620;
  basic_string_view<char,_std::char_traits<char>_> local_618;
  bool local_601;
  undefined1 local_600 [8];
  AssertionResult gtest_ar__5;
  Message local_5e8;
  int64_t local_5e0;
  undefined1 local_5d4 [4];
  undefined1 local_5d0 [8];
  AssertionResult gtest_ar_10;
  AssertHelper local_5a0;
  Message local_598;
  basic_string_view<char,_std::char_traits<char>_> local_590;
  bool local_579;
  undefined1 local_578 [8];
  AssertionResult gtest_ar__4;
  Message local_560;
  int64_t local_558;
  undefined1 local_54c [4];
  undefined1 local_548 [8];
  AssertionResult gtest_ar_9;
  AssertHelper local_518;
  Message local_510;
  basic_string_view<char,_std::char_traits<char>_> local_508;
  bool local_4f1;
  undefined1 local_4f0 [8];
  AssertionResult gtest_ar__3;
  Message local_4d8;
  int64_t local_4d0;
  undefined1 local_4c4 [4];
  undefined1 local_4c0 [8];
  AssertionResult gtest_ar_8;
  AssertHelper local_490;
  Message local_488;
  basic_string_view<char,_std::char_traits<char>_> local_480;
  bool local_469;
  undefined1 local_468 [8];
  AssertionResult gtest_ar__2;
  Duration d;
  Message local_428;
  Duration local_420;
  string local_3f8;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar_7;
  Message local_3c0;
  Duration local_3b8;
  string local_390;
  undefined1 local_370 [8];
  AssertionResult gtest_ar_6;
  Message local_358;
  Duration local_350;
  string local_328;
  undefined1 local_308 [8];
  AssertionResult gtest_ar_5;
  Message local_2f0;
  Duration local_2e8;
  string local_2c0;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar_4;
  Message local_288;
  Duration local_280;
  int32_t local_258;
  int local_254;
  undefined1 local_250 [8];
  AssertionResult gtest_ar_3;
  Message local_238;
  Duration local_230;
  int32_t local_208;
  int local_204;
  undefined1 local_200 [8];
  AssertionResult gtest_ar_2;
  Message local_1e8;
  Duration local_1e0;
  string local_1b8;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_1;
  Message local_180;
  Duration local_178;
  string local_150;
  undefined1 local_130 [8];
  AssertionResult gtest_ar;
  AssertHelper local_100;
  Message local_f8;
  string_view local_f0;
  bool local_d9;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_a8;
  Message local_a0;
  string_view local_98;
  bool local_81;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_;
  undefined1 local_60 [8];
  Timestamp end;
  Timestamp begin;
  TimeUtilTest_DurationStringFormat_Test *this_local;
  
  Timestamp::Timestamp((Timestamp *)((long)&end.field_0 + 0x10));
  Timestamp::Timestamp((Timestamp *)local_60);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_98,"0001-01-01T00:00:00Z");
  local_81 = TimeUtil::FromString(local_98,(Timestamp *)((long)&end.field_0 + 0x10));
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_80,&local_81,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_80,
               (AssertionResult *)"TimeUtil::FromString(\"0001-01-01T00:00:00Z\", &begin)","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x4b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_f0,"9999-12-31T23:59:59.999999999Z");
  local_d9 = TimeUtil::FromString(local_f0,(Timestamp *)local_60);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_d8,&local_d9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_d8,
               (AssertionResult *)"TimeUtil::FromString(\"9999-12-31T23:59:59.999999999Z\", &end)",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x4c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_100,&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  protobuf::operator-(&local_178,(Timestamp *)local_60,(Timestamp *)((long)&end.field_0 + 0x10));
  TimeUtil::ToString_abi_cxx11_(&local_150,(TimeUtil *)&local_178,duration);
  testing::internal::EqHelper::
  Compare<char[24],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_130,"\"315537897599.999999999s\"","TimeUtil::ToString(end - begin)",
             (char (*) [24])0x1ed0333,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  Duration::~Duration(&local_178);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(&local_180);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x50,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  protobuf::operator-(&local_1e0,(Timestamp *)((long)&end.field_0 + 0x10),(Timestamp *)local_60);
  TimeUtil::ToString_abi_cxx11_(&local_1b8,(TimeUtil *)&local_1e0,duration_00);
  testing::internal::EqHelper::
  Compare<char[25],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_198,"\"-315537897599.999999999s\"","TimeUtil::ToString(begin - end)",
             (char (*) [25])"-315537897599.999999999s",&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  Duration::~Duration(&local_1e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x51,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  local_204 = 999999999;
  protobuf::operator-(&local_230,(Timestamp *)local_60,(Timestamp *)((long)&end.field_0 + 0x10));
  local_208 = Duration::nanos(&local_230);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_200,"999999999","(end - begin).nanos()",&local_204,&local_208);
  Duration::~Duration(&local_230);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
  if (!bVar1) {
    testing::Message::Message(&local_238);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_200);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x53,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
  local_254 = -999999999;
  protobuf::operator-(&local_280,(Timestamp *)((long)&end.field_0 + 0x10),(Timestamp *)local_60);
  local_258 = Duration::nanos(&local_280);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_250,"-999999999","(begin - end).nanos()",&local_254,&local_258);
  Duration::~Duration(&local_280);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
  if (!bVar1) {
    testing::Message::Message(&local_288);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_250);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x54,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_288);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
  TimeUtil::SecondsToDuration(&local_2e8,1);
  TimeUtil::ToString_abi_cxx11_(&local_2c0,(TimeUtil *)&local_2e8,duration_01);
  testing::internal::EqHelper::
  Compare<char[3],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_2a0,"\"1s\"","TimeUtil::ToString(TimeUtil::SecondsToDuration(1))",
             (char (*) [3])0x1ed0873,&local_2c0);
  std::__cxx11::string::~string((string *)&local_2c0);
  Duration::~Duration(&local_2e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
  if (!bVar1) {
    testing::Message::Message(&local_2f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x57,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_2f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_2f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
  TimeUtil::MillisecondsToDuration(&local_350,10);
  TimeUtil::ToString_abi_cxx11_(&local_328,(TimeUtil *)&local_350,duration_02);
  testing::internal::EqHelper::
  Compare<char[7],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_308,"\"0.010s\"",
             "TimeUtil::ToString(TimeUtil::MillisecondsToDuration(10))",(char (*) [7])"0.010s",
             &local_328);
  std::__cxx11::string::~string((string *)&local_328);
  Duration::~Duration(&local_350);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
  if (!bVar1) {
    testing::Message::Message(&local_358);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_308);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x58,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_358);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_358);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
  TimeUtil::MicrosecondsToDuration(&local_3b8,10);
  TimeUtil::ToString_abi_cxx11_(&local_390,(TimeUtil *)&local_3b8,duration_03);
  testing::internal::EqHelper::
  Compare<char[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_370,"\"0.000010s\"",
             "TimeUtil::ToString(TimeUtil::MicrosecondsToDuration(10))",(char (*) [10])"0.000010s",
             &local_390);
  std::__cxx11::string::~string((string *)&local_390);
  Duration::~Duration(&local_3b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
  if (!bVar1) {
    testing::Message::Message(&local_3c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_370);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x5a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_3c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_3c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
  TimeUtil::NanosecondsToDuration(&local_420,10);
  TimeUtil::ToString_abi_cxx11_(&local_3f8,(TimeUtil *)&local_420,duration_04);
  pcVar2 = "0.000000010s";
  testing::internal::EqHelper::
  Compare<char[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_3d8,"\"0.000000010s\"",
             "TimeUtil::ToString(TimeUtil::NanosecondsToDuration(10))",(char (*) [13])"0.000000010s"
             ,&local_3f8);
  std::__cxx11::string::~string((string *)&local_3f8);
  Duration::~Duration(&local_420);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
  if (!bVar1) {
    testing::Message::Message(&local_428);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_3d8);
    pcVar2 = (char *)0x5c;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&d.field_0 + 0x10),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x5c,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)((long)&d.field_0 + 0x10),&local_428)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&d.field_0 + 0x10));
    testing::Message::~Message(&local_428);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
  Duration::Duration((Duration *)&gtest_ar__2.message_);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_480,"0.1s");
  value._M_str = (char *)&gtest_ar__2.message_;
  value._M_len = (size_t)local_480._M_str;
  local_469 = TimeUtil::FromString((TimeUtil *)local_480._M_len,value,(Duration *)pcVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_468,&local_469,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_468);
  if (!bVar1) {
    testing::Message::Message(&local_488);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_8.message_,(internal *)local_468,
               (AssertionResult *)"TimeUtil::FromString(\"0.1s\", &d)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_490,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x61,pcVar2);
    testing::internal::AssertHelper::operator=(&local_490,&local_488);
    testing::internal::AssertHelper::~AssertHelper(&local_490);
    std::__cxx11::string::~string((string *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_488);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_468);
  local_4c4 = (undefined1  [4])0x64;
  local_4d0 = TimeUtil::DurationToMilliseconds((Duration *)&gtest_ar__2.message_);
  pDVar3 = (Duration *)local_4c4;
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_4c0,"100","TimeUtil::DurationToMilliseconds(d)",(int *)pDVar3,
             &local_4d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c0);
  if (!bVar1) {
    testing::Message::Message(&local_4d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4c0);
    pDVar3 = (Duration *)0x62;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x62,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3.message_,&local_4d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_4d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_508,"0.0001s");
  value_00._M_str = (char *)&gtest_ar__2.message_;
  value_00._M_len = (size_t)local_508._M_str;
  local_4f1 = TimeUtil::FromString((TimeUtil *)local_508._M_len,value_00,pDVar3);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4f0,&local_4f1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f0);
  if (!bVar1) {
    testing::Message::Message(&local_510);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_9.message_,(internal *)local_4f0,
               (AssertionResult *)"TimeUtil::FromString(\"0.0001s\", &d)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_518,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,99,pcVar2);
    testing::internal::AssertHelper::operator=(&local_518,&local_510);
    testing::internal::AssertHelper::~AssertHelper(&local_518);
    std::__cxx11::string::~string((string *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_510);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f0);
  local_54c = (undefined1  [4])0x64;
  local_558 = TimeUtil::DurationToMicroseconds((Duration *)&gtest_ar__2.message_);
  pDVar3 = (Duration *)local_54c;
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_548,"100","TimeUtil::DurationToMicroseconds(d)",(int *)pDVar3,
             &local_558);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_548);
  if (!bVar1) {
    testing::Message::Message(&local_560);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_548);
    pDVar3 = (Duration *)0x64;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,100,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4.message_,&local_560);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_560);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_548);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_590,"0.0000001s");
  value_01._M_str = (char *)&gtest_ar__2.message_;
  value_01._M_len = (size_t)local_590._M_str;
  local_579 = TimeUtil::FromString((TimeUtil *)local_590._M_len,value_01,pDVar3);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_578,&local_579,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_578);
  if (!bVar1) {
    testing::Message::Message(&local_598);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_10.message_,(internal *)local_578,
               (AssertionResult *)"TimeUtil::FromString(\"0.0000001s\", &d)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_5a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x65,pcVar2);
    testing::internal::AssertHelper::operator=(&local_5a0,&local_598);
    testing::internal::AssertHelper::~AssertHelper(&local_5a0);
    std::__cxx11::string::~string((string *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_598);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_578);
  local_5d4 = (undefined1  [4])0x64;
  local_5e0 = TimeUtil::DurationToNanoseconds((Duration *)&gtest_ar__2.message_);
  pDVar3 = (Duration *)local_5d4;
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_5d0,"100","TimeUtil::DurationToNanoseconds(d)",(int *)pDVar3,
             &local_5e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d0);
  if (!bVar1) {
    testing::Message::Message(&local_5e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5d0);
    pDVar3 = (Duration *)0x66;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x66,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__5.message_,&local_5e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_5e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_618,"315576000000.999999999s");
  value_02._M_str = (char *)&gtest_ar__2.message_;
  value_02._M_len = (size_t)local_618._M_str;
  local_601 = TimeUtil::FromString((TimeUtil *)local_618._M_len,value_02,pDVar3);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_600,&local_601,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_600);
  if (!bVar1) {
    testing::Message::Message(&local_620);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_11.message_,(internal *)local_600,
               (AssertionResult *)"TimeUtil::FromString(\"315576000000.999999999s\", &d)","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_628,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x6a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_628,&local_620);
    testing::internal::AssertHelper::~AssertHelper(&local_628);
    std::__cxx11::string::~string((string *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_620);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_600);
  local_660 = 0x4979cb9e00;
  local_668 = Duration::seconds((Duration *)&gtest_ar__2.message_);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_658,"int64_t{315576000000}","d.seconds()",&local_660,&local_668);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_658);
  if (!bVar1) {
    testing::Message::Message(&local_670);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_658);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x6b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_670);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_670);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_658);
  local_68c = (undefined1  [4])0x3b9ac9ff;
  local_690 = Duration::nanos((Duration *)&gtest_ar__2.message_);
  pDVar3 = (Duration *)local_68c;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_688,"999999999","d.nanos()",(int *)pDVar3,&local_690);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_688);
  if (!bVar1) {
    testing::Message::Message(&local_698);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_688);
    pDVar3 = (Duration *)0x6c;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x6c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__6.message_,&local_698);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_698);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_688);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_6c8,"-315576000000.999999999s");
  value_03._M_str = (char *)&gtest_ar__2.message_;
  value_03._M_len = (size_t)local_6c8._M_str;
  local_6b1 = TimeUtil::FromString((TimeUtil *)local_6c8._M_len,value_03,pDVar3);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6b0,&local_6b1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6b0);
  if (!bVar1) {
    testing::Message::Message(&local_6d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_13.message_,(internal *)local_6b0,
               (AssertionResult *)"TimeUtil::FromString(\"-315576000000.999999999s\", &d)","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_6d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x6d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_6d8,&local_6d0);
    testing::internal::AssertHelper::~AssertHelper(&local_6d8);
    std::__cxx11::string::~string((string *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_6d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6b0);
  local_710 = -0x4979cb9e00;
  local_718 = Duration::seconds((Duration *)&gtest_ar__2.message_);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_708,"int64_t{-315576000000}","d.seconds()",&local_710,&local_718);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_708);
  if (!bVar1) {
    testing::Message::Message(&local_720);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_708);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x6e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_720);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_720);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_708);
  local_73c = -999999999;
  local_740 = Duration::nanos((Duration *)&gtest_ar__2.message_);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_738,"-999999999","d.nanos()",&local_73c,&local_740);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_738);
  if (!bVar1) {
    testing::Message::Message(&local_748);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_738);
    testing::internal::AssertHelper::AssertHelper
              (&local_750,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x6f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_750,&local_748);
    testing::internal::AssertHelper::~AssertHelper(&local_750);
    testing::Message::~Message(&local_748);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_738);
  Duration::~Duration((Duration *)&gtest_ar__2.message_);
  Timestamp::~Timestamp((Timestamp *)local_60);
  Timestamp::~Timestamp((Timestamp *)((long)&end.field_0 + 0x10));
  return;
}

Assistant:

TEST(TimeUtilTest, DurationStringFormat) {
  Timestamp begin, end;
  EXPECT_TRUE(TimeUtil::FromString("0001-01-01T00:00:00Z", &begin));
  EXPECT_TRUE(TimeUtil::FromString("9999-12-31T23:59:59.999999999Z", &end));

  // These these are out of bounds for 32-bit architectures.
  if(sizeof(time_t) >= sizeof(uint64_t)) {
    EXPECT_EQ("315537897599.999999999s", TimeUtil::ToString(end - begin));
    EXPECT_EQ("-315537897599.999999999s", TimeUtil::ToString(begin - end));
  }
  EXPECT_EQ(999999999, (end - begin).nanos());
  EXPECT_EQ(-999999999, (begin - end).nanos());

  // Generated output should contain 3, 6, or 9 fractional digits.
  EXPECT_EQ("1s", TimeUtil::ToString(TimeUtil::SecondsToDuration(1)));
  EXPECT_EQ("0.010s", TimeUtil::ToString(TimeUtil::MillisecondsToDuration(10)));
  EXPECT_EQ("0.000010s",
            TimeUtil::ToString(TimeUtil::MicrosecondsToDuration(10)));
  EXPECT_EQ("0.000000010s",
            TimeUtil::ToString(TimeUtil::NanosecondsToDuration(10)));

  // Parsing accepts an fractional digits as long as they fit into nano
  // precision.
  Duration d;
  EXPECT_TRUE(TimeUtil::FromString("0.1s", &d));
  EXPECT_EQ(100, TimeUtil::DurationToMilliseconds(d));
  EXPECT_TRUE(TimeUtil::FromString("0.0001s", &d));
  EXPECT_EQ(100, TimeUtil::DurationToMicroseconds(d));
  EXPECT_TRUE(TimeUtil::FromString("0.0000001s", &d));
  EXPECT_EQ(100, TimeUtil::DurationToNanoseconds(d));

  // Duration must support range from -315,576,000,000s to +315576000000s
  // which includes negative values.
  EXPECT_TRUE(TimeUtil::FromString("315576000000.999999999s", &d));
  EXPECT_EQ(int64_t{315576000000}, d.seconds());
  EXPECT_EQ(999999999, d.nanos());
  EXPECT_TRUE(TimeUtil::FromString("-315576000000.999999999s", &d));
  EXPECT_EQ(int64_t{-315576000000}, d.seconds());
  EXPECT_EQ(-999999999, d.nanos());
}